

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

Aig_Obj_t * Saig_ManGetLabeledRegister_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  
  do {
    if (pObj->TravId == p->nTravIds) {
      return (Aig_Obj_t *)0x0;
    }
    pObj->TravId = p->nTravIds;
    uVar1 = (uint)*(ulong *)&pObj->field_0x18;
    if ((uVar1 & 7) == 2) {
      if ((pObj->field_0).CioId < p->nTruePis) {
        return (Aig_Obj_t *)0x0;
      }
      if ((pObj->field_0).CioId < p->nTruePis) goto LAB_0065b703;
      if ((*(ulong *)&pObj->field_0x18 & 0x30) != 0) {
        return pObj;
      }
      if ((pObj->field_0).CioId < p->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar1 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppAVar3 = (Aig_Obj_t **)((long)p->vCos->pArray[uVar1] + 8);
    }
    else {
LAB_0065b703:
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x375,"Aig_Obj_t *Saig_ManGetLabeledRegister_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar2 = Saig_ManGetLabeledRegister_rec
                         (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        return pAVar2;
      }
      ppAVar3 = &pObj->pFanin1;
    }
    pObj = (Aig_Obj_t *)((ulong)*ppAVar3 & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

Aig_Obj_t * Saig_ManGetLabeledRegister_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pResult;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return NULL;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPi(p, pObj) )
        return NULL;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        if ( pObj->fMarkA || pObj->fMarkB )
            return pObj;
        return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ) );
    }
    assert( Aig_ObjIsNode(pObj) );
    pResult = Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin0(pObj) );
    if ( pResult )
        return pResult;
    return Saig_ManGetLabeledRegister_rec( p, Aig_ObjFanin1(pObj) );
}